

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureStorageMultisampleTexStorage2DMultisampleTests.cpp
# Opt level: O2

void __thiscall
glcts::MultisampleTextureTexStorage2DReconfigurationRejectedTest::deinitTexture
          (MultisampleTextureTexStorage2DReconfigurationRejectedTest *this,GLuint *to_id,
          GLenum texture_target)

{
  int iVar1;
  deUint32 dVar2;
  undefined4 extraout_var;
  long lVar3;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar3 + 0xb8))(texture_target,0);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"Failed to unbind a texture object",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleTexStorage2DMultisampleTests.cpp"
                  ,0x22e);
  (**(code **)(lVar3 + 0x480))(1,to_id);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"Failed to delete texture object",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleTexStorage2DMultisampleTests.cpp"
                  ,0x233);
  *to_id = 0;
  return;
}

Assistant:

void MultisampleTextureTexStorage2DReconfigurationRejectedTest::deinitTexture(glw::GLuint& to_id,
																			  glw::GLenum  texture_target)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Unbind texture object bound to texture_target target */
	gl.bindTexture(texture_target, 0);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to unbind a texture object");

	/* Delete texture object */
	gl.deleteTextures(1, &to_id);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to delete texture object");

	to_id = 0;
}